

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

_Bool tcache_bin_info_settings_parse
                (char *bin_settings_segment_cur,size_t len_left,
                cache_bin_info_t *duckdb_je_tcache_bin_info,_Bool *bin_info_is_set)

{
  size_t size;
  _Bool _Var1;
  szind_t sVar2;
  szind_t sVar3;
  szind_t i;
  size_t ncached_max;
  size_t size_end;
  size_t size_start;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  char *local_38;
  
  local_48 = len_left;
  local_38 = bin_settings_segment_cur;
  do {
    _Var1 = duckdb_je_multi_setting_parse_next(&local_38,&local_48,&local_40,&local_50,&local_58);
    if (_Var1) {
      return _Var1;
    }
    if (0x800000 < local_50) {
      local_50 = 0x800000;
    }
    size = local_50;
    if (local_40 <= local_50 && local_40 < 0x800001) {
      sVar2 = sz_size2index_compute(local_40);
      sVar3 = sz_size2index_compute(size);
      if (0x1fff < local_58) {
        local_58 = 0x1fff;
      }
      for (; sVar2 <= sVar3; sVar2 = sVar2 + 1) {
        duckdb_je_cache_bin_info_init(duckdb_je_tcache_bin_info + sVar2,(cache_bin_sz_t)local_58);
        if (bin_info_is_set != (_Bool *)0x0) {
          bin_info_is_set[sVar2] = true;
        }
      }
    }
  } while (local_48 != 0);
  return _Var1;
}

Assistant:

static bool
tcache_bin_info_settings_parse(const char *bin_settings_segment_cur,
    size_t len_left, cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX],
    bool bin_info_is_set[TCACHE_NBINS_MAX]) {
	do {
		size_t size_start, size_end;
		size_t ncached_max;
		bool err = multi_setting_parse_next(&bin_settings_segment_cur,
		    &len_left, &size_start, &size_end, &ncached_max);
		if (err) {
			return true;
		}
		if (size_end > TCACHE_MAXCLASS_LIMIT) {
			size_end = TCACHE_MAXCLASS_LIMIT;
		}
		if (size_start > TCACHE_MAXCLASS_LIMIT ||
		    size_start > size_end) {
			continue;
		}
		/* May get called before sz_init (during malloc_conf_init). */
		szind_t bin_start = sz_size2index_compute(size_start);
		szind_t bin_end = sz_size2index_compute(size_end);
		if (ncached_max > CACHE_BIN_NCACHED_MAX) {
			ncached_max = (size_t)CACHE_BIN_NCACHED_MAX;
		}
		for (szind_t i = bin_start; i <= bin_end; i++) {
			cache_bin_info_init(&tcache_bin_info[i],
			    (cache_bin_sz_t)ncached_max);
			if (bin_info_is_set != NULL) {
				bin_info_is_set[i] = true;
			}
		}
	} while (len_left > 0);

	return false;
}